

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.hpp
# Opt level: O0

shared_ptr<helics::TranslatorOperator> __thiscall
helics::BinaryTranslatorOperation::getOperator(BinaryTranslatorOperation *this)

{
  element_type *in_RDI;
  shared_ptr<helics::TranslatorOperator> sVar1;
  
  sVar1 = std::static_pointer_cast<helics::TranslatorOperator,helics::BinaryTranslatorOperator>
                    ((shared_ptr<helics::BinaryTranslatorOperator> *)in_RDI);
  sVar1.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::TranslatorOperator>)
         sVar1.super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TranslatorOperator> getOperator() override
    {
        return std::static_pointer_cast<TranslatorOperator>(to);
    }